

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_enclosing_tet(REF_GRID ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT limit;
  REF_INT step;
  REF_DBL inside;
  REF_INT local_b8;
  REF_INT guess;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *bary_local;
  REF_INT *tet_local;
  REF_DBL *xyz_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[8];
  ref_node_00 = ref_grid->node;
  inside._4_4_ = *tet;
  if ((((int)inside._4_4_ < 0) || (ref_cell_00->max <= (int)inside._4_4_)) ||
     (ref_cell_00->c2n[(int)(ref_cell_00->size_per * inside._4_4_)] == -1)) {
    inside._4_4_ = 0;
    while (((int)inside._4_4_ < ref_cell_00->max &&
           ((((int)inside._4_4_ < 0 || (ref_cell_00->max <= (int)inside._4_4_)) ||
            (ref_cell_00->c2n[(int)(ref_cell_00->size_per * inside._4_4_)] == -1))))) {
      inside._4_4_ = inside._4_4_ + 1;
    }
  }
  ref_private_macro_code_rss = 0;
  while( true ) {
    if (999 < ref_private_macro_code_rss) {
      ref_grid_local._4_4_ = ref_grid_exhaustive_enclosing_tet(ref_grid,xyz,tet,bary);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",999,
               "ref_grid_enclosing_tet",(ulong)ref_grid_local._4_4_,"enclose");
      }
      return ref_grid_local._4_4_;
    }
    if ((((int)inside._4_4_ < 0) || (ref_cell_00->max <= (int)inside._4_4_)) ||
       (ref_cell_00->c2n[(int)(ref_cell_00->size_per * inside._4_4_)] == -1)) {
      uVar1 = ref_grid_exhaustive_enclosing_tet(ref_grid,xyz,tet,bary);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x39f,"ref_grid_enclosing_tet",(ulong)uVar1,"enclose");
        return uVar1;
      }
      return 0;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,inside._4_4_,&local_b8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3a3,
             "ref_grid_enclosing_tet",(ulong)uVar1,"cell");
      return uVar1;
    }
    uVar1 = ref_node_bary4(ref_node_00,&local_b8,xyz,bary);
    if ((uVar1 != 0) && (uVar1 != 4)) break;
    if (0x3de < ref_private_macro_code_rss) {
      printf("step %d, tet %d, bary %e %e %e %e inside %e\n",*bary,bary[1],bary[2],bary[3],
             0xbd719799812dea11,(ulong)(uint)ref_private_macro_code_rss,(ulong)inside._4_4_);
    }
    if ((((-1e-12 <= *bary) && (-1e-12 <= bary[1])) && (-1e-12 <= bary[2])) && (-1e-12 <= bary[3]))
    {
      *tet = inside._4_4_;
      return 0;
    }
    if (((bary[1] <= *bary) || (bary[2] <= *bary)) || (bary[3] <= *bary)) {
      if (((*bary <= bary[1]) || (bary[3] <= bary[1])) || (bary[2] <= bary[1])) {
        if (((*bary <= bary[2]) || (bary[1] <= bary[2])) || (bary[3] <= bary[2])) {
          if (((*bary <= bary[3]) || (bary[2] <= bary[3])) || (bary[1] <= bary[3])) {
            if (((bary[1] < *bary) || (bary[2] < *bary)) || (bary[3] < *bary)) {
              if (((*bary < bary[1]) || (bary[3] < bary[1])) || (bary[2] < bary[1])) {
                if (((*bary < bary[2]) || (bary[1] < bary[2])) || (bary[3] < bary[2])) {
                  if (((*bary < bary[3]) || (bary[2] < bary[3])) || (bary[1] < bary[3])) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x3e3,"ref_grid_enclosing_tet","unable to find the next step");
                    return 1;
                  }
                  uVar1 = ref_update_tet_guess
                                    (ref_cell_00,local_b8,nodes[0],guess,
                                     (REF_INT *)((long)&inside + 4));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x3df,"ref_grid_enclosing_tet",(ulong)uVar1,"update 0 2 1");
                    return uVar1;
                  }
                }
                else {
                  uVar1 = ref_update_tet_guess
                                    (ref_cell_00,local_b8,guess,nodes[1],
                                     (REF_INT *)((long)&inside + 4));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x3d9,"ref_grid_enclosing_tet",(ulong)uVar1,"update 0 1 3");
                    return uVar1;
                  }
                }
              }
              else {
                uVar1 = ref_update_tet_guess
                                  (ref_cell_00,local_b8,nodes[1],nodes[0],
                                   (REF_INT *)((long)&inside + 4));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x3d3,"ref_grid_enclosing_tet",(ulong)uVar1,"update 0 3 2");
                  return uVar1;
                }
              }
            }
            else {
              uVar1 = ref_update_tet_guess
                                (ref_cell_00,guess,nodes[0],nodes[1],(REF_INT *)((long)&inside + 4))
              ;
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x3cd,"ref_grid_enclosing_tet",(ulong)uVar1,"update 1 2 3");
                return uVar1;
              }
            }
          }
          else {
            uVar1 = ref_update_tet_guess
                              (ref_cell_00,local_b8,nodes[0],guess,(REF_INT *)((long)&inside + 4));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x3c6,"ref_grid_enclosing_tet",(ulong)uVar1,"update 0 2 1");
              return uVar1;
            }
          }
        }
        else {
          uVar1 = ref_update_tet_guess
                            (ref_cell_00,local_b8,guess,nodes[1],(REF_INT *)((long)&inside + 4));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x3c0,"ref_grid_enclosing_tet",(ulong)uVar1,"update 0 1 3");
            return uVar1;
          }
        }
      }
      else {
        uVar1 = ref_update_tet_guess
                          (ref_cell_00,local_b8,nodes[1],nodes[0],(REF_INT *)((long)&inside + 4));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x3ba,"ref_grid_enclosing_tet",(ulong)uVar1,"update 0 3 2");
          return uVar1;
        }
      }
    }
    else {
      uVar1 = ref_update_tet_guess
                        (ref_cell_00,guess,nodes[0],nodes[1],(REF_INT *)((long)&inside + 4));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x3b4,"ref_grid_enclosing_tet",(ulong)uVar1,"update 1 2 3");
        return uVar1;
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3a4,
         "ref_grid_enclosing_tet",(ulong)uVar1,"bary");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_enclosing_tet(REF_GRID ref_grid, REF_DBL *xyz,
                                          REF_INT *tet, REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess;
  REF_DBL inside;
  REF_INT step, limit;

  guess = *tet;
  if (!ref_cell_valid(ref_cell, guess)) {
    each_ref_cell_valid_cell(ref_cell, guess) { break; }
  }

  limit = 1000;      /* was 10e6^(1/3), required 108 for twod testcase  */
  inside = -1.0e-12; /* initial inside tolerance  */

  for (step = 0; step < limit; step++) {
    /* exhaustive search if cell is invalid */
    if (!ref_cell_valid(ref_cell, guess)) {
      RSS(ref_grid_exhaustive_enclosing_tet(ref_grid, xyz, tet, bary),
          "enclose");
      return REF_SUCCESS;
    }

    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");

    if (step > 990) {
      printf("step %d, tet %d, bary %e %e %e %e inside %e\n", step, guess,
             bary[0], bary[1], bary[2], bary[3], inside);
    }

    if (bary[0] >= inside && bary[1] >= inside && bary[2] >= inside &&
        bary[3] >= inside) {
      *tet = guess;
      return REF_SUCCESS;
    }

    /* less than */
    if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[1], nodes[2], nodes[3], &guess),
          "update 1 2 3");
      continue;
    }

    if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[3], nodes[2], &guess),
          "update 0 3 2");
      continue;
    }

    if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[1], nodes[3], &guess),
          "update 0 1 3");
      continue;
    }

    if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[2], nodes[1], &guess),
          "update 0 2 1");
      continue;
    }

    /* less than or equal */
    if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[1], nodes[2], nodes[3], &guess),
          "update 1 2 3");
      continue;
    }

    if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[3], nodes[2], &guess),
          "update 0 3 2");
      continue;
    }

    if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[1], nodes[3], &guess),
          "update 0 1 3");
      continue;
    }

    if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[2], nodes[1], &guess),
          "update 0 2 1");
      continue;
    }

    THROW("unable to find the next step");
  }

  /* exhaustive search when walk runs out of iterations */
  RSS(ref_grid_exhaustive_enclosing_tet(ref_grid, xyz, tet, bary), "enclose");

  return REF_SUCCESS;
}